

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_map.hpp
# Opt level: O0

type __thiscall
itlib::
flat_map<Rml::RenderManager*,Rml::CallbackTexture,itlib::fmimpl::less,std::vector<std::pair<Rml::RenderManager*,Rml::CallbackTexture>,std::allocator<std::pair<Rml::RenderManager*,Rml::CallbackTexture>>>>
::operator[]<Rml::RenderManager*>
          (flat_map<Rml::RenderManager*,Rml::CallbackTexture,itlib::fmimpl::less,std::vector<std::pair<Rml::RenderManager*,Rml::CallbackTexture>,std::allocator<std::pair<Rml::RenderManager*,Rml::CallbackTexture>>>>
           *this,RenderManager **k)

{
  iterator iVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  reference b;
  pointer ppVar4;
  void *extraout_RDX;
  __normal_iterator<std::pair<Rml::RenderManager_*,_Rml::CallbackTexture>_*,_std::vector<std::pair<Rml::RenderManager_*,_Rml::CallbackTexture>,_std::allocator<std::pair<Rml::RenderManager_*,_Rml::CallbackTexture>_>_>_>
  *__rhs;
  byte local_65;
  CallbackTexture local_58;
  const_iterator local_40;
  pair<Rml::RenderManager_*,_Rml::CallbackTexture> *local_38;
  __normal_iterator<std::pair<Rml::RenderManager_*,_Rml::CallbackTexture>_*,_std::vector<std::pair<Rml::RenderManager_*,_Rml::CallbackTexture>,_std::allocator<std::pair<Rml::RenderManager_*,_Rml::CallbackTexture>_>_>_>
  local_30;
  __normal_iterator<std::pair<Rml::RenderManager_*,_Rml::CallbackTexture>_*,_std::vector<std::pair<Rml::RenderManager_*,_Rml::CallbackTexture>,_std::allocator<std::pair<Rml::RenderManager_*,_Rml::CallbackTexture>_>_>_>
  local_28;
  iterator i;
  RenderManager **k_local;
  flat_map<Rml::RenderManager_*,_Rml::CallbackTexture,_itlib::fmimpl::less,_std::vector<std::pair<Rml::RenderManager_*,_Rml::CallbackTexture>,_std::allocator<std::pair<Rml::RenderManager_*,_Rml::CallbackTexture>_>_>_>
  *this_local;
  
  i._M_current = (pair<Rml::RenderManager_*,_Rml::CallbackTexture> *)k;
  local_28._M_current =
       (pair<Rml::RenderManager_*,_Rml::CallbackTexture> *)lower_bound<Rml::RenderManager*>(this,k);
  local_30._M_current =
       (pair<Rml::RenderManager_*,_Rml::CallbackTexture> *)
       flat_map<Rml::RenderManager_*,_Rml::CallbackTexture,_itlib::fmimpl::less,_std::vector<std::pair<Rml::RenderManager_*,_Rml::CallbackTexture>,_std::allocator<std::pair<Rml::RenderManager_*,_Rml::CallbackTexture>_>_>_>
       ::end((flat_map<Rml::RenderManager_*,_Rml::CallbackTexture,_itlib::fmimpl::less,_std::vector<std::pair<Rml::RenderManager_*,_Rml::CallbackTexture>,_std::allocator<std::pair<Rml::RenderManager_*,_Rml::CallbackTexture>_>_>_>
              *)this);
  __rhs = &local_30;
  bVar2 = __gnu_cxx::operator!=(&local_28,__rhs);
  local_65 = 0;
  if (bVar2) {
    iVar3 = flat_map<Rml::RenderManager_*,_Rml::CallbackTexture,_itlib::fmimpl::less,_std::vector<std::pair<Rml::RenderManager_*,_Rml::CallbackTexture>,_std::allocator<std::pair<Rml::RenderManager_*,_Rml::CallbackTexture>_>_>_>
            ::cmp((flat_map<Rml::RenderManager_*,_Rml::CallbackTexture,_itlib::fmimpl::less,_std::vector<std::pair<Rml::RenderManager_*,_Rml::CallbackTexture>,_std::allocator<std::pair<Rml::RenderManager_*,_Rml::CallbackTexture>_>_>_>
                   *)this,__rhs,extraout_RDX);
    iVar1 = i;
    b = __gnu_cxx::
        __normal_iterator<std::pair<Rml::RenderManager_*,_Rml::CallbackTexture>_*,_std::vector<std::pair<Rml::RenderManager_*,_Rml::CallbackTexture>,_std::allocator<std::pair<Rml::RenderManager_*,_Rml::CallbackTexture>_>_>_>
        ::operator*(&local_28);
    bVar2 = fmimpl::pair_compare<Rml::RenderManager*,Rml::CallbackTexture,itlib::fmimpl::less>::
            operator()((void *)CONCAT44(extraout_var,iVar3),&(iVar1._M_current)->first,b);
    local_65 = bVar2 ^ 0xff;
  }
  if ((local_65 & 1) == 0) {
    __gnu_cxx::
    __normal_iterator<std::pair<Rml::RenderManager*,Rml::CallbackTexture>const*,std::vector<std::pair<Rml::RenderManager*,Rml::CallbackTexture>,std::allocator<std::pair<Rml::RenderManager*,Rml::CallbackTexture>>>>
    ::__normal_iterator<std::pair<Rml::RenderManager*,Rml::CallbackTexture>*>
              ((__normal_iterator<std::pair<Rml::RenderManager*,Rml::CallbackTexture>const*,std::vector<std::pair<Rml::RenderManager*,Rml::CallbackTexture>,std::allocator<std::pair<Rml::RenderManager*,Rml::CallbackTexture>>>>
                *)&local_40,&local_28);
    iVar1 = i;
    local_58.
    super_UniqueRenderResource<Rml::CallbackTexture,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
    .render_manager = (RenderManager *)0x0;
    local_58.
    super_UniqueRenderResource<Rml::CallbackTexture,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
    .resource_handle = ~Invalid;
    local_58.
    super_UniqueRenderResource<Rml::CallbackTexture,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
    ._12_4_ = 0;
    Rml::CallbackTexture::CallbackTexture(&local_58);
    local_38 = (pair<Rml::RenderManager_*,_Rml::CallbackTexture> *)
               std::
               vector<std::pair<Rml::RenderManager*,Rml::CallbackTexture>,std::allocator<std::pair<Rml::RenderManager*,Rml::CallbackTexture>>>
               ::emplace<Rml::RenderManager*,Rml::CallbackTexture>
                         ((vector<std::pair<Rml::RenderManager*,Rml::CallbackTexture>,std::allocator<std::pair<Rml::RenderManager*,Rml::CallbackTexture>>>
                           *)this,local_40,&(iVar1._M_current)->first,&local_58);
    local_28._M_current = local_38;
    Rml::CallbackTexture::~CallbackTexture(&local_58);
    ppVar4 = __gnu_cxx::
             __normal_iterator<std::pair<Rml::RenderManager_*,_Rml::CallbackTexture>_*,_std::vector<std::pair<Rml::RenderManager_*,_Rml::CallbackTexture>,_std::allocator<std::pair<Rml::RenderManager_*,_Rml::CallbackTexture>_>_>_>
             ::operator->(&local_28);
  }
  else {
    ppVar4 = __gnu_cxx::
             __normal_iterator<std::pair<Rml::RenderManager_*,_Rml::CallbackTexture>_*,_std::vector<std::pair<Rml::RenderManager_*,_Rml::CallbackTexture>,_std::allocator<std::pair<Rml::RenderManager_*,_Rml::CallbackTexture>_>_>_>
             ::operator->(&local_28);
  }
  this_local = (flat_map<Rml::RenderManager_*,_Rml::CallbackTexture,_itlib::fmimpl::less,_std::vector<std::pair<Rml::RenderManager_*,_Rml::CallbackTexture>,_std::allocator<std::pair<Rml::RenderManager_*,_Rml::CallbackTexture>_>_>_>
                *)&ppVar4->second;
  return (type)this_local;
}

Assistant:

typename std::enable_if<std::is_constructible<key_type, K>::value,
    mapped_type&>::type operator[](K&& k)
    {
        auto i = lower_bound(k);
        if (i != end() && !cmp()(k, *i))
        {
            return i->second;
        }

        i = m_container.emplace(i, std::forward<K>(k), mapped_type());
        return i->second;
    }